

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

bool test_SSTable_fileIO(void)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  SSTableHeader *pSVar4;
  SSTableIndex *pSVar5;
  SSTableData *pSVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  initializer_list<SSTableDataEntry> __l;
  SSTable s;
  SSTableData data;
  SSTable t;
  SSTable SStack_198;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_158;
  path local_140;
  SSTableDataEntry local_118;
  SSTableDataEntry local_d8;
  SSTableDataEntry local_98;
  SSTableDataEntry local_58;
  
  SSTableDataEntry::SSTableDataEntry(&local_118,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_d8,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_98,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_58,false,0x75998cb,4,"NIMO");
  __l._M_len = 4;
  __l._M_array = &local_118;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&local_158,__l,(allocator_type *)&SStack_198);
  lVar7 = -0x100;
  paVar8 = &local_58.value.field_2;
  do {
    if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar8->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],paVar8->_M_allocated_capacity + 1
                     );
    }
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar8->_M_allocated_capacity + -8);
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0);
  SSTable::SSTable((SSTable *)&local_118);
  SSTable::fillData((SSTable *)&local_118,&local_158);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&SStack_198.file,(char (*) [10])"testf.bin",auto_format);
  SSTable::writeToDisk((SSTable *)&local_118,&SStack_198.file);
  std::filesystem::__cxx11::path::~path(&SStack_198.file);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&local_140,(char (*) [10])"testf.bin",auto_format);
  SSTable::SSTable(&SStack_198,&local_140);
  std::filesystem::__cxx11::path::~path(&local_140);
  pSVar4 = SSTable::getHeader(&SStack_198);
  if ((((pSVar4->key_min == 1) && (pSVar4->entries_count == 4)) && (pSVar4->key_max == 4)) &&
     (pSVar4->index_offset == 0x99)) {
    pSVar5 = SSTable::getIndex(&SStack_198);
    pSVar1 = (pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((((((long)(pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 == 0x40) &&
          (pSVar1->key == 1)) &&
         ((pSVar1->offset == 0x20 && ((pSVar1[1].key == 2 && (pSVar1[1].offset == 0x45)))))) &&
        (pSVar1[2].key == 3)) &&
       (((pSVar1[2].offset == 99 && (pSVar1[3].key == 4)) && (pSVar1[3].offset == 0x7c)))) {
      pSVar6 = SSTable::getAllData(&SStack_198);
      remove("testf.bin");
      pSVar2 = (pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((((long)(pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 == 0x100) &&
          (pSVar2[3].delete_flag == false)) &&
         ((pSVar2[3].timestamp == 0x75998cb && (pSVar2[3].key == 4)))) {
        iVar3 = std::__cxx11::string::compare((char *)&pSVar2[3].value);
        bVar9 = iVar3 == 0;
        goto LAB_0010470f;
      }
    }
  }
  bVar9 = false;
LAB_0010470f:
  SSTable::~SSTable(&SStack_198);
  SSTable::~SSTable((SSTable *)&local_118);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_158);
  return bVar9;
}

Assistant:

bool test_SSTable_fileIO() {
    auto data = SSTableData{
            {false, 12345678,   1, "Hello,World!"},
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"}
    };
    auto t = SSTable{};
    t.fillData(data);
    t.writeToDisk("testf.bin");

    auto s = SSTable{"testf.bin"};

    auto *h = s.getHeader();

    if (h->key_min != 1 || h->entries_count != 4 || h->key_max != 4 || h->index_offset != 32 + (25 * 4 + 12 + 5 + 4)) {
        return false;
    }

    auto &index = *s.getIndex();

    if (
            index.size() != 4 ||
            index[0].key != 1 ||
            index[0].offset != 32 ||
            index[1].key != 2 ||
            index[1].offset != 69 ||
            index[2].key != 3 ||
            index[2].offset != 99 ||
            index[3].key != 4 ||
            index[3].offset != 124
            ) {
        return false;
    }
    auto &d = *s.getAllData();

    remove("testf.bin");
    return !(d.size() != 4 || d[3].delete_flag != false || d[3].timestamp != 123312331 || d[3].key != 4 ||
             d[3].value != "NIMO");
}